

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall
NEST::LArNEST::GetNRPhotonYieldsConserved(LArNEST *this,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double efield_local;
  double energy_local;
  LArNEST *this_local;
  
  dVar1 = (this->fNR).alpha;
  dVar3 = pow(energy,(this->fNR).beta);
  dVar2 = (this->fNR).gamma;
  dVar4 = pow(efield,(this->fNR).delta);
  dVar5 = sqrt(energy + (this->fNR).epsilon);
  dVar6 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  return dVar1 * dVar3 + -((1.0 / (dVar2 * dVar4)) * (1.0 / dVar5) * (1.0 - 1.0 / (dVar6 + 1.0)));
}

Assistant:

double LArNEST::GetNRPhotonYieldsConserved(double energy, double efield) {
  return fNR.alpha * pow(energy, fNR.beta) -
         (1.0 / (fNR.gamma * pow(efield, fNR.delta))) *
             (1.0 / sqrt(energy + fNR.epsilon)) *
             (1.0 - 1.0 / (1.0 + pow(energy / fNR.zeta, fNR.eta)));
}